

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psysclose-unix.c
# Opt level: O0

pint p_sys_close(pint fd)

{
  int iVar1;
  pint fd_local;
  
  iVar1 = close(fd);
  return iVar1;
}

Assistant:

pint
p_sys_close (pint fd)
{
#if defined (EINTR) && defined (P_OS_HPUX)
	pint res;
	pint err_code;

	for (;;) {
		res = close (fd);

		if (P_LIKELY (res == 0))
			return 0;

		err_code = p_error_get_last_system ();

		if (err_code == EINTR)
			continue;
		else
			return -1;
	}
#else
	return close (fd);
#endif
}